

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatten_x86.cpp
# Opt level: O0

int __thiscall
ncnn::Flatten_x86::forward_int8(Flatten_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  long in_RCX;
  Mat *in_RDX;
  Mat *in_RSI;
  undefined8 in_RDI;
  int i_2;
  char *outptr;
  char *ptr_2;
  int q_1;
  int i_1;
  char *outptr7_1;
  char *outptr6_1;
  char *outptr5_1;
  char *outptr4_1;
  char *outptr3_1;
  char *outptr2_1;
  char *outptr1_1;
  char *outptr0_1;
  char *ptr_1;
  int q;
  int j;
  char *outptr7;
  char *outptr6;
  char *outptr5;
  char *outptr4;
  char *outptr3;
  char *outptr2;
  char *outptr1;
  char *outptr0;
  char *ptr;
  int i;
  size_t out_elemsize;
  int out_elempack;
  int total;
  int size;
  int elempack;
  size_t elemsize;
  int channels;
  int d;
  int h;
  int w;
  int dims;
  Mat *in_stack_fffffffffffffe20;
  Mat *in_stack_fffffffffffffe28;
  Mat *this_00;
  size_t in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe44;
  Mat *in_stack_fffffffffffffe48;
  Mat local_1b0;
  char *local_168;
  int local_160;
  int local_15c;
  char *local_158;
  Option *in_stack_fffffffffffffeb0;
  Mat *in_stack_fffffffffffffeb8;
  Mat *in_stack_fffffffffffffec0;
  Flatten *in_stack_fffffffffffffec8;
  char *local_130;
  char *local_128;
  char *local_120;
  Mat local_108;
  char *local_c0;
  int local_b8;
  int local_b4;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  char *local_80;
  char *local_78;
  char *local_70;
  int local_64;
  size_t local_60;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  ulong local_48;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  Mat *local_20;
  Mat *local_18;
  int local_4;
  
  local_2c = in_RSI->dims;
  if (local_2c == 1) {
    ncnn::Mat::operator=(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    local_4 = 0;
  }
  else {
    local_30 = in_RSI->w;
    local_34 = in_RSI->h;
    local_38 = in_RSI->d;
    local_3c = in_RSI->c;
    local_48 = in_RSI->elemsize;
    local_4c = in_RSI->elempack;
    local_50 = local_30 * local_34 * local_38;
    local_54 = local_50 * local_3c * local_4c;
    local_58 = 1;
    if (((*(byte *)(in_RCX + 0x27) & 1) != 0) && (local_58 = 1, local_54 % 8 == 0)) {
      local_58 = 8;
    }
    local_60 = (local_48 / (ulong)(long)local_4c) * (long)local_58;
    if (local_58 == 1) {
      local_4 = Flatten::forward(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                                 in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
    }
    else {
      local_20 = in_RDX;
      if ((local_2c == 2) && (local_4c == 1)) {
        ncnn::Mat::operator=(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
        local_20->dims = 1;
        local_20->w = local_54 / local_58;
        local_20->h = 1;
        local_20->cstep = (long)local_20->w;
        local_20->elemsize = local_60;
        local_20->elempack = local_58;
        local_4 = 0;
      }
      else {
        local_18 = in_RSI;
        ncnn::Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                          (int)((ulong)in_RDI >> 0x20),in_stack_fffffffffffffe30,
                          (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                          (Allocator *)in_stack_fffffffffffffe20);
        bVar1 = ncnn::Mat::empty(in_stack_fffffffffffffe20);
        if (bVar1) {
          local_4 = -100;
        }
        else {
          if ((local_2c == 2) && (local_4c == 8)) {
            for (local_64 = 0; local_64 < local_34; local_64 = local_64 + 1) {
              local_70 = ncnn::Mat::row<signed_char_const>(local_18,local_64);
              local_78 = ncnn::Mat::operator_cast_to_signed_char_(local_20);
              local_78 = local_78 + local_30 * local_64 * 8;
              local_80 = ncnn::Mat::operator_cast_to_signed_char_(local_20);
              local_80 = local_80 + local_30 * (local_64 * 8 + 1);
              local_88 = ncnn::Mat::operator_cast_to_signed_char_(local_20);
              local_88 = local_88 + local_30 * (local_64 * 8 + 2);
              local_90 = ncnn::Mat::operator_cast_to_signed_char_(local_20);
              local_90 = local_90 + local_30 * (local_64 * 8 + 3);
              local_98 = ncnn::Mat::operator_cast_to_signed_char_(local_20);
              local_98 = local_98 + local_30 * (local_64 * 8 + 4);
              local_a0 = ncnn::Mat::operator_cast_to_signed_char_(local_20);
              local_a0 = local_a0 + local_30 * (local_64 * 8 + 5);
              local_a8 = ncnn::Mat::operator_cast_to_signed_char_(local_20);
              local_a8 = local_a8 + local_30 * (local_64 * 8 + 6);
              pcVar2 = ncnn::Mat::operator_cast_to_signed_char_(local_20);
              local_b0 = pcVar2 + local_30 * (local_64 * 8 + 7);
              for (local_b4 = 0; local_b4 < local_30; local_b4 = local_b4 + 1) {
                *local_78 = *local_70;
                *local_80 = local_70[1];
                *local_88 = local_70[2];
                *local_90 = local_70[3];
                *local_98 = local_70[4];
                *local_a0 = local_70[5];
                *local_a8 = local_70[6];
                *local_b0 = local_70[7];
                local_70 = local_70 + 8;
                local_b0 = local_b0 + 1;
                local_a8 = local_a8 + 1;
                local_a0 = local_a0 + 1;
                local_98 = local_98 + 1;
                local_90 = local_90 + 1;
                local_88 = local_88 + 1;
                local_80 = local_80 + 1;
                local_78 = local_78 + 1;
              }
            }
          }
          if ((local_2c == 3) || (local_2c == 4)) {
            if (local_4c == 8) {
              for (local_b8 = 0; local_b8 < local_3c; local_b8 = local_b8 + 1) {
                this_00 = &local_108;
                ncnn::Mat::channel(in_stack_fffffffffffffe48,in_stack_fffffffffffffe44);
                pcVar2 = ncnn::Mat::operator_cast_to_signed_char_(this_00);
                ncnn::Mat::~Mat((Mat *)0x390355);
                local_c0 = pcVar2;
                pcVar3 = ncnn::Mat::operator_cast_to_signed_char_(local_20);
                iVar10 = local_50 * local_b8;
                pcVar4 = ncnn::Mat::operator_cast_to_signed_char_(local_20);
                iVar11 = local_50 * (local_b8 * 8 + 1);
                pcVar5 = ncnn::Mat::operator_cast_to_signed_char_(local_20);
                iVar12 = local_50 * (local_b8 * 8 + 2);
                pcVar6 = ncnn::Mat::operator_cast_to_signed_char_(local_20);
                pcVar6 = pcVar6 + local_50 * (local_b8 * 8 + 3);
                pcVar7 = ncnn::Mat::operator_cast_to_signed_char_(local_20);
                pcVar7 = pcVar7 + local_50 * (local_b8 * 8 + 4);
                pcVar8 = ncnn::Mat::operator_cast_to_signed_char_(local_20);
                pcVar8 = pcVar8 + local_50 * (local_b8 * 8 + 5);
                pcVar2 = ncnn::Mat::operator_cast_to_signed_char_(local_20);
                pcVar2 = pcVar2 + local_50 * (local_b8 * 8 + 6);
                pcVar9 = ncnn::Mat::operator_cast_to_signed_char_(local_20);
                local_158 = pcVar9 + local_50 * (local_b8 * 8 + 7);
                local_130 = pcVar5 + iVar12;
                local_128 = pcVar4 + iVar11;
                local_120 = pcVar3 + iVar10 * 8;
                for (local_15c = 0; local_15c < local_50; local_15c = local_15c + 1) {
                  *local_120 = *local_c0;
                  *local_128 = local_c0[1];
                  *local_130 = local_c0[2];
                  *pcVar6 = local_c0[3];
                  *pcVar7 = local_c0[4];
                  *pcVar8 = local_c0[5];
                  *pcVar2 = local_c0[6];
                  *local_158 = local_c0[7];
                  local_c0 = local_c0 + 8;
                  local_158 = local_158 + 1;
                  pcVar2 = pcVar2 + 1;
                  pcVar8 = pcVar8 + 1;
                  pcVar7 = pcVar7 + 1;
                  pcVar6 = pcVar6 + 1;
                  local_130 = local_130 + 1;
                  local_128 = local_128 + 1;
                  local_120 = local_120 + 1;
                }
              }
            }
            if (local_4c == 1) {
              for (local_160 = 0; local_160 < local_3c; local_160 = local_160 + 1) {
                ncnn::Mat::channel(in_stack_fffffffffffffe48,in_stack_fffffffffffffe44);
                pcVar2 = ncnn::Mat::operator_cast_to_signed_char_(&local_1b0);
                ncnn::Mat::~Mat((Mat *)0x3906f9);
                local_168 = pcVar2;
                pcVar2 = ncnn::Mat::operator_cast_to_signed_char_(local_20);
                in_stack_fffffffffffffe48 = (Mat *)(pcVar2 + local_50 * local_160);
                for (in_stack_fffffffffffffe44 = 0; in_stack_fffffffffffffe44 < local_50;
                    in_stack_fffffffffffffe44 = in_stack_fffffffffffffe44 + 1) {
                  *(char *)&in_stack_fffffffffffffe48->data = *local_168;
                  in_stack_fffffffffffffe48 = (Mat *)((long)&in_stack_fffffffffffffe48->data + 1);
                  local_168 = local_168 + 1;
                }
              }
            }
          }
          local_4 = 0;
        }
      }
    }
  }
  return local_4;
}

Assistant:

int Flatten_x86::forward_int8(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int dims = bottom_blob.dims;

    if (dims == 1)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;
    int size = w * h * d;

    int total = size * channels * elempack;

    int out_elempack = 1;
    if (opt.use_packing_layout)
    {
        out_elempack = total % 8 == 0 ? 8 : 1;
    }
    size_t out_elemsize = elemsize / elempack * out_elempack;

    if (out_elempack == 1)
    {
        return Flatten::forward(bottom_blob, top_blob, opt);
    }

    if (dims == 2 && elempack == 1) // out_elempack == 8
    {
        top_blob = bottom_blob;
        top_blob.dims = 1;
        top_blob.w = total / out_elempack;
        top_blob.h = 1;
        top_blob.cstep = top_blob.w;
        top_blob.elemsize = out_elemsize;
        top_blob.elempack = out_elempack;
        return 0;
    }

    top_blob.create(total / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (dims == 2)
    {
        if (elempack == 8) // out_elempack == 8
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const signed char* ptr = bottom_blob.row<const signed char>(i);
                signed char* outptr0 = (signed char*)top_blob + w * i * 8;
                signed char* outptr1 = (signed char*)top_blob + w * (i * 8 + 1);
                signed char* outptr2 = (signed char*)top_blob + w * (i * 8 + 2);
                signed char* outptr3 = (signed char*)top_blob + w * (i * 8 + 3);
                signed char* outptr4 = (signed char*)top_blob + w * (i * 8 + 4);
                signed char* outptr5 = (signed char*)top_blob + w * (i * 8 + 5);
                signed char* outptr6 = (signed char*)top_blob + w * (i * 8 + 6);
                signed char* outptr7 = (signed char*)top_blob + w * (i * 8 + 7);

                int j = 0;
                for (; j < w; j++)
                {
                    *outptr0++ = ptr[0];
                    *outptr1++ = ptr[1];
                    *outptr2++ = ptr[2];
                    *outptr3++ = ptr[3];
                    *outptr4++ = ptr[4];
                    *outptr5++ = ptr[5];
                    *outptr6++ = ptr[6];
                    *outptr7++ = ptr[7];

                    ptr += 8;
                }
            }
        }
    }

    if (dims == 3 || dims == 4)
    {
        if (elempack == 8) // out_elempack == 8
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const signed char* ptr = bottom_blob.channel(q);
                signed char* outptr0 = (signed char*)top_blob + size * q * 8;
                signed char* outptr1 = (signed char*)top_blob + size * (q * 8 + 1);
                signed char* outptr2 = (signed char*)top_blob + size * (q * 8 + 2);
                signed char* outptr3 = (signed char*)top_blob + size * (q * 8 + 3);
                signed char* outptr4 = (signed char*)top_blob + size * (q * 8 + 4);
                signed char* outptr5 = (signed char*)top_blob + size * (q * 8 + 5);
                signed char* outptr6 = (signed char*)top_blob + size * (q * 8 + 6);
                signed char* outptr7 = (signed char*)top_blob + size * (q * 8 + 7);

                int i = 0;
                for (; i < size; i++)
                {
                    *outptr0++ = ptr[0];
                    *outptr1++ = ptr[1];
                    *outptr2++ = ptr[2];
                    *outptr3++ = ptr[3];
                    *outptr4++ = ptr[4];
                    *outptr5++ = ptr[5];
                    *outptr6++ = ptr[6];
                    *outptr7++ = ptr[7];

                    ptr += 8;
                }
            }
        }

        if (elempack == 1) // out_elempack == 8
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const signed char* ptr = bottom_blob.channel(q);
                signed char* outptr = (signed char*)top_blob + size * q;

                int i = 0;
                for (; i < size; i++)
                {
                    *outptr++ = *ptr++;
                }
            }
        }
    }

    return 0;
}